

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void nng_stats_dump(nng_stat *stat)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  char *pcVar5;
  char *pcVar6;
  nng_stat *local_38;
  nni_stat *child;
  unsigned_long_long val;
  char *indent;
  char *scope;
  nng_stat *pnStack_10;
  int len;
  nng_stat *stat_local;
  
  pnStack_10 = stat;
  iVar2 = nng_stat_type(stat);
  switch(iVar2) {
  case 0:
    indent = nng_stats_dump::buf;
    scope._4_4_ = 0x80;
    stat_sprint_scope(pnStack_10,&indent,(int *)((long)&scope + 4));
    sVar3 = strlen(nng_stats_dump::buf);
    scope._4_4_ = (int)sVar3;
    if ((0 < scope._4_4_) && (nng_stats_dump::buf[scope._4_4_ + -1] == '.')) {
      scope._4_4_ = scope._4_4_ + -1;
      nng_stats_dump::buf[scope._4_4_] = '\0';
    }
    if (0 < scope._4_4_) {
      nni_plat_printf("\n%s:\n",nng_stats_dump::buf);
    }
    break;
  case 1:
  case 2:
    uVar4 = nng_stat_value(pnStack_10);
    pcVar5 = nng_stat_name(pnStack_10);
    nni_plat_printf("%s%-32s%llu","        ",pcVar5,uVar4);
    iVar2 = nng_stat_unit(pnStack_10);
    switch(iVar2) {
    case 0:
    case 4:
    default:
      nni_plat_printf("\n");
      break;
    case 1:
      nni_plat_printf(" bytes\n");
      break;
    case 2:
      nni_plat_printf(" msgs\n");
      break;
    case 3:
      nni_plat_printf(" ms\n");
    }
    break;
  case 3:
    pcVar5 = nng_stat_name(pnStack_10);
    pcVar6 = nng_stat_string(pnStack_10);
    nni_plat_printf("%s%-32s\"%s\"\n","        ",pcVar5,pcVar6);
    break;
  case 4:
    pcVar5 = nng_stat_name(pnStack_10);
    _Var1 = nng_stat_bool(pnStack_10);
    pcVar6 = "false";
    if (_Var1) {
      pcVar6 = "true";
    }
    nni_plat_printf("%s%-32s%s\n","        ",pcVar5,pcVar6);
    break;
  case 5:
    uVar4 = nng_stat_value(pnStack_10);
    pcVar5 = nng_stat_name(pnStack_10);
    nni_plat_printf("%s%-32s%llu\n","        ",pcVar5,uVar4);
    break;
  default:
    pcVar5 = nng_stat_name(pnStack_10);
    nni_plat_printf("%s%-32s<?>\n","        ",pcVar5);
  }
  for (local_38 = (nng_stat *)nni_list_first(&pnStack_10->s_children); local_38 != (nng_stat *)0x0;
      local_38 = (nng_stat *)nni_list_next(&pnStack_10->s_children,local_38)) {
    nng_stats_dump(local_38);
  }
  return;
}

Assistant:

void
nng_stats_dump(const nng_stat *stat)
{
#ifdef NNG_ENABLE_STATS
	static char        buf[128]; // to minimize recursion, not thread safe
	int                len;
	char              *scope;
	char              *indent = "        ";
	unsigned long long val;
	nni_stat          *child;

	switch (nng_stat_type(stat)) {
	case NNG_STAT_SCOPE:
		scope = buf;
		len   = sizeof(buf);
		stat_sprint_scope(stat, &scope, &len);
		len = (int) strlen(buf);
		if (len > 0) {
			if (buf[len - 1] == '.') {
				buf[--len] = '\0';
			}
		}
		if (len > 0) {
			nni_plat_printf("\n%s:\n", buf);
		}
		break;
	case NNG_STAT_STRING:
		nni_plat_printf("%s%-32s\"%s\"\n", indent, nng_stat_name(stat),
		    nng_stat_string(stat));
		break;
	case NNG_STAT_BOOLEAN:
		nni_plat_printf("%s%-32s%s\n", indent, nng_stat_name(stat),
		    nng_stat_bool(stat) ? "true" : "false");
		break;
	case NNG_STAT_LEVEL:
	case NNG_STAT_COUNTER:
		val = nng_stat_value(stat);
		nni_plat_printf(
		    "%s%-32s%llu", indent, nng_stat_name(stat), val);
		switch (nng_stat_unit(stat)) {
		case NNG_UNIT_BYTES:
			nni_plat_printf(" bytes\n");
			break;
		case NNG_UNIT_MESSAGES:
			nni_plat_printf(" msgs\n");
			break;
		case NNG_UNIT_MILLIS:
			nni_plat_printf(" ms\n");
			break;
		case NNG_UNIT_NONE:
		case NNG_UNIT_EVENTS:
		default:
			nni_plat_printf("\n");
			break;
		}
		break;
	case NNG_STAT_ID:
		val = nng_stat_value(stat);
		nni_plat_printf(
		    "%s%-32s%llu\n", indent, nng_stat_name(stat), val);
		break;
	default:
		nni_plat_printf("%s%-32s<?>\n", indent, nng_stat_name(stat));
		break;
	}

	NNI_LIST_FOREACH (&stat->s_children, child) {
		nng_stats_dump(child);
	}
#else
	NNI_ARG_UNUSED(stat);
#endif
}